

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O0

bool __thiscall re2::Regexp::ParseState::DoLeftParen(ParseState *this,StringPiece *name)

{
  bool bVar1;
  Regexp *pRVar2;
  const_pointer pcVar3;
  string *this_00;
  int iVar4;
  allocator<char> local_2d [13];
  Regexp *local_20;
  Regexp *re;
  StringPiece *name_local;
  ParseState *this_local;
  
  re = (Regexp *)name;
  name_local = (StringPiece *)this;
  pRVar2 = (Regexp *)operator_new((size_t)this);
  Regexp(pRVar2,kRegexpCharClass|kRegexpEmptyMatch,this->flags_);
  iVar4 = this->ncap_ + 1;
  this->ncap_ = iVar4;
  (pRVar2->field_7).field_0.max_ = iVar4;
  local_20 = pRVar2;
  pcVar3 = StringPiece::data((StringPiece *)re);
  if (pcVar3 != (const_pointer)0x0) {
    this_00 = (string *)operator_new((size_t)this);
    pRVar2 = re;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<re2::StringPiece,void>
              ((string *)this_00,(StringPiece *)pRVar2,local_2d);
    (local_20->field_7).field_1.name_ = this_00;
    std::allocator<char>::~allocator(local_2d);
  }
  bVar1 = PushRegexp(this,local_20);
  return bVar1;
}

Assistant:

bool Regexp::ParseState::DoLeftParen(const StringPiece& name) {
  Regexp* re = new Regexp(kLeftParen, flags_);
  re->cap_ = ++ncap_;
  if (name.data() != NULL)
    re->name_ = new std::string(name);
  return PushRegexp(re);
}